

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int __thiscall options::parse(options *this,int argc,char **argv)

{
  pointer pCVar1;
  pointer pPVar2;
  iterator iVar3;
  int iVar4;
  size_t sVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  int c;
  Compression CVar9;
  PixelMode PVar10;
  undefined4 in_register_00000034;
  iterator iVar11;
  char *pcVar12;
  ostream *poVar13;
  value_type *__x;
  _List_node_base *p_Var14;
  bool bVar15;
  double dVar16;
  Compression compression;
  string i;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  PixelMode local_98;
  int local_94;
  long *local_90;
  long local_88;
  long local_80 [2];
  vector<PixelMode,_std::allocator<PixelMode>_> *local_70;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<Imf_3_4::Compression,std::allocator<Imf_3_4::Compression>> *local_50;
  vector<const_char_*,_std::allocator<const_char_*>_> *local_48;
  undefined8 local_40;
  char **local_38;
  
  local_40 = CONCAT44(in_register_00000034,argc);
  this->timing = 7;
  if (argc == 1) {
    usageMessage((ostream *)&std::cerr,"exrmetrics",true);
    return 1;
  }
  if (argc < 2) {
LAB_00108c47:
    if ((this->inFiles).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (this->inFiles).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Missing input file\n",0x13);
      usageMessage((ostream *)&std::cerr,"exrmetrics",false);
    }
    else {
      if (((this->outputSizeData != false) || (this->timing != 0)) || (this->outFile != (char *)0x0)
         ) {
        iVar11._M_current =
             (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar11._M_current ==
            (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_90 = (long *)((ulong)local_90 & 0xffffffff00000000);
          if (iVar11._M_current ==
              (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<PixelMode,_std::allocator<PixelMode>_>::_M_realloc_insert<PixelMode>
                      (&this->pixelModes,iVar11,(PixelMode *)&local_90);
          }
          else {
            *iVar11._M_current = PIXELMODE_ORIGINAL;
            (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar11._M_current + 1;
          }
        }
        iVar3._M_current =
             (this->compressions).
             super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->compressions).
            super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_90 = (long *)CONCAT44(local_90._4_4_,10);
          if (iVar3._M_current ==
              (this->compressions).
              super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>::
            _M_realloc_insert<Imf_3_4::Compression>
                      (&this->compressions,iVar3,(Compression *)&local_90);
            return 0;
          }
          *iVar3._M_current = NUM_COMPRESSION_METHODS;
          (this->compressions).
          super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          return 0;
        }
        return 0;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Nothing to do: no output file specified, and all performance/size data disabled",
                 0x4f);
      pcVar12 = "Use -o to specify output image filename\n";
      lVar8 = 0x28;
      poVar13 = (ostream *)&std::cerr;
LAB_00108c99:
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar12,lVar8);
    }
    return 1;
  }
  local_48 = &this->inFiles;
  local_94 = argc + -2;
  local_70 = &this->pixelModes;
  local_50 = (vector<Imf_3_4::Compression,std::allocator<Imf_3_4::Compression>> *)
             &this->compressions;
  iVar6 = 1;
LAB_001081de:
  pcVar12 = argv[iVar6];
  iVar4 = strcmp(pcVar12,"-h");
  if ((iVar4 == 0) || (iVar4 = strcmp(pcVar12,"--help"), iVar4 == 0)) {
    usageMessage((ostream *)&std::cout,"exrmetrics",true);
    return 0;
  }
  iVar4 = strcmp(pcVar12,"--version");
  if (iVar4 == 0) {
    pcVar12 = (char *)Imf_3_4::getLibraryVersion();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"exrmetrics (OpenEXR) ",0x15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"3.4.0",5);
    iVar6 = strcmp(pcVar12,"3.4.0");
    if (iVar6 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"(OpenEXR version ",0x11);
      if (pcVar12 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x117320);
      }
      else {
        sVar5 = strlen(pcVar12);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar12,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," https://openexr.com",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Copyright (c) Contributors to the OpenEXR Project",0x31);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"License BSD-3-Clause",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    return 0;
  }
  iVar4 = strcmp(pcVar12,"-m");
  if (iVar4 == 0) {
    this->threads = -1;
  }
  else {
    __x = argv + iVar6;
    iVar4 = strcmp(pcVar12,"-t");
    if (iVar4 == 0) {
      if (local_94 < iVar6) {
        poVar13 = (ostream *)&std::cerr;
        pcVar12 = "Missing thread count value with -t option\n";
        lVar8 = 0x2a;
        goto LAB_00108c99;
      }
      iVar4 = atoi(__x[1]);
      this->threads = iVar4;
      if (iVar4 < 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"bad thread count ",0x11);
        pcVar12 = __x[1];
        if (pcVar12 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x117530);
        }
        else {
          sVar5 = strlen(pcVar12);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,sVar5);
        }
        poVar13 = (ostream *)&std::cerr;
        pcVar12 = " specified to -t option\n";
        lVar8 = 0x18;
        goto LAB_00108c99;
      }
LAB_0010841f:
      iVar6 = iVar6 + 2;
      goto LAB_0010842a;
    }
    iVar4 = strcmp(pcVar12,"--bench");
    if (iVar4 == 0) {
      pCVar1 = (this->compressions).
               super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->compressions).
          super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>._M_impl.
          super__Vector_impl_data._M_finish != pCVar1) {
        (this->compressions).
        super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>._M_impl.
        super__Vector_impl_data._M_finish = pCVar1;
      }
      CVar9 = NO_COMPRESSION;
      do {
        local_90 = (long *)CONCAT44(local_90._4_4_,CVar9);
        iVar3._M_current =
             (this->compressions).
             super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->compressions).
            super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>::
          _M_realloc_insert<Imf_3_4::Compression>
                    ((vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_> *)local_50
                     ,iVar3,(Compression *)&local_90);
        }
        else {
          *iVar3._M_current = CVar9;
          (this->compressions).
          super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        CVar9 = CVar9 + RLE_COMPRESSION;
      } while (CVar9 != NUM_COMPRESSION_METHODS);
      this->passes = 10;
      this->timing = 6;
      this->outputSizeData = false;
      this->csv = true;
      this->part = -1;
      std::vector<PixelMode,_std::allocator<PixelMode>_>::resize(local_70,2);
      pPVar2 = (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>._M_impl.
               super__Vector_impl_data._M_start;
      pPVar2[0] = PIXELMODE_ALL_HALF;
      pPVar2[1] = PIXELMODE_ALL_FLOAT;
      iVar6 = iVar6 + 1;
      goto LAB_0010842a;
    }
    iVar4 = strcmp(pcVar12,"--convert");
    if (iVar4 == 0) {
      std::vector<PixelMode,_std::allocator<PixelMode>_>::resize(local_70,1);
      *(this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>._M_impl.
       super__Vector_impl_data._M_start = PIXELMODE_ORIGINAL;
      this->passes = 1;
      this->timing = 0;
      this->outputSizeData = false;
      this->part = -1;
    }
    else {
      iVar4 = strcmp(pcVar12,"--passes");
      if (iVar4 == 0) {
        if (local_94 < iVar6) {
          pcVar12 = "Missing pass count value with --passes option\n";
LAB_00108f8e:
          poVar13 = (ostream *)&std::cerr;
          lVar8 = 0x2e;
        }
        else {
          iVar4 = atoi(__x[1]);
          this->passes = iVar4;
          if (-1 < iVar4) goto LAB_0010841f;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"bad value for passes ",0x15);
          poVar13 = std::operator<<((ostream *)&std::cerr,__x[1]);
          pcVar12 = " specified to --passes option\n";
          lVar8 = 0x1e;
        }
        goto LAB_00108c99;
      }
      iVar4 = strcmp(pcVar12,"-v");
      if (iVar4 == 0) {
        this->verbose = true;
      }
      else {
        iVar4 = strcmp(pcVar12,"--csv");
        if (iVar4 == 0) {
          this->csv = true;
        }
        else {
          iVar4 = strcmp(pcVar12,"--json");
          if (iVar4 == 0) {
            this->csv = false;
            goto LAB_001083f2;
          }
          iVar4 = strcmp(pcVar12,"-z");
          if ((iVar4 == 0) || (iVar4 = strcmp(pcVar12,"--compression"), iVar4 == 0)) {
            pCVar1 = (this->compressions).
                     super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((this->compressions).
                super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>.
                _M_impl.super__Vector_impl_data._M_finish != pCVar1) {
              (this->compressions).
              super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>.
              _M_impl.super__Vector_impl_data._M_finish = pCVar1;
            }
            if (iVar6 <= local_94) {
              split_abi_cxx11_((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_68,__x[1],',');
              bVar15 = local_68._M_impl._M_node.super__List_node_base._M_next ==
                       (_List_node_base *)&local_68;
              local_38 = argv;
              p_Var14 = local_68._M_impl._M_node.super__List_node_base._M_next;
              while (!bVar15) {
                local_90 = local_80;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_90,p_Var14[1]._M_next,
                           (long)&(p_Var14[1]._M_prev)->_M_next + (long)p_Var14[1]._M_next);
                iVar4 = std::__cxx11::string::compare((char *)&local_90);
                if (iVar4 == 0) {
                  local_98 = 10;
                  iVar3._M_current =
                       (this->compressions).
                       super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar3._M_current ==
                      (this->compressions).
                      super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>::
                    _M_realloc_insert<Imf_3_4::Compression>
                              ((vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>
                                *)local_50,iVar3,&local_98);
                  }
                  else {
                    *iVar3._M_current = NUM_COMPRESSION_METHODS;
                    (this->compressions).
                    super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>.
                    _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                  }
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)&local_90);
                  if (iVar4 == 0) {
                    PVar10 = PIXELMODE_ORIGINAL;
                    do {
                      iVar3._M_current =
                           (this->compressions).
                           super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                      local_98 = PVar10;
                      if (iVar3._M_current ==
                          (this->compressions).
                          super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        std::vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>::
                        _M_realloc_insert<Imf_3_4::Compression>
                                  ((vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>
                                    *)local_50,iVar3,&local_98);
                      }
                      else {
                        *iVar3._M_current = PVar10;
                        (this->compressions).
                        super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>
                        ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                      }
                      PVar10 = PVar10 + PIXELMODE_ALL_HALF;
                    } while (PVar10 != 10);
                  }
                  else {
                    Imf_3_4::getCompressionIdFromName((string *)&local_90,&local_98);
                    PVar10 = local_98;
                    if (local_98 == 10) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"unknown compression type ",0x19);
                      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cerr,(char *)local_90,local_88);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) +
                                      (char)poVar13);
                      std::ostream::put((char)poVar13);
                      std::ostream::flush();
                    }
                    else {
                      iVar3._M_current =
                           (this->compressions).
                           super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                      if (iVar3._M_current ==
                          (this->compressions).
                          super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        std::vector<Imf_3_4::Compression,std::allocator<Imf_3_4::Compression>>::
                        _M_realloc_insert<Imf_3_4::Compression_const&>(local_50,iVar3,&local_98);
                      }
                      else {
                        *iVar3._M_current = local_98;
                        (this->compressions).
                        super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>
                        ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                      }
                    }
                    if (PVar10 == 10) {
                      if (local_90 != local_80) {
                        operator_delete(local_90,local_80[0] + 1);
                      }
                      break;
                    }
                  }
                }
                if (local_90 != local_80) {
                  operator_delete(local_90,local_80[0] + 1);
                }
                p_Var14 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&p_Var14->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
                bVar15 = p_Var14 == (_List_node_base *)&local_68;
              }
              std::__cxx11::
              _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::_M_clear(&local_68);
              bVar15 = !bVar15;
              argv = local_38;
              iVar4 = iVar6 + 2;
              if (bVar15) {
                iVar4 = iVar6;
              }
LAB_0010872f:
              iVar6 = iVar4;
              if (bVar15) {
                return 1;
              }
              goto LAB_0010842a;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Missing compression value with ",0x1f);
            poVar13 = std::operator<<((ostream *)&std::cerr,*__x);
            pcVar12 = " option\n";
            lVar8 = 8;
            goto LAB_00108c99;
          }
          iVar4 = strcmp(pcVar12,"-p");
          if (iVar4 == 0) {
            if (local_94 < iVar6) {
              pcVar12 = "Missing part number with -p option\n";
LAB_001090b0:
              poVar13 = (ostream *)&std::cerr;
              lVar8 = 0x23;
              goto LAB_00108c99;
            }
            pcVar12 = __x[1];
            iVar4 = strcmp(pcVar12,"all");
            if (iVar4 == 0) {
              this->part = -1;
            }
            else {
              iVar4 = atoi(pcVar12);
              this->part = iVar4;
              if (iVar4 < -1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"bad part ",9);
                poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->part);
                pcVar12 = " specified to -p option\n";
                goto LAB_00109095;
              }
            }
LAB_00108817:
            iVar6 = iVar6 + 2;
            goto LAB_0010842a;
          }
          iVar4 = strcmp(pcVar12,"-l");
          if (iVar4 == 0) {
            if (local_94 < iVar6) {
              pcVar12 = "Missing compression level number with -l option\n";
LAB_0010902a:
              poVar13 = (ostream *)&std::cerr;
              lVar8 = 0x30;
              goto LAB_00108c99;
            }
            dVar16 = atof(__x[1]);
            this->level = (float)dVar16;
            if ((float)dVar16 < 0.0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"bad level ",10);
              poVar13 = std::ostream::_M_insert<double>((double)this->level);
              pcVar12 = " specified to -l option\n";
LAB_00109095:
              lVar8 = 0x18;
              goto LAB_00108c99;
            }
            goto LAB_00108817;
          }
          iVar4 = strcmp(pcVar12,"-o");
          if (iVar4 == 0) {
            if (local_94 < iVar6) {
              pcVar12 = "Missing filename specified with -o\n";
              goto LAB_001090b0;
            }
            if (this->outFile != (char *)0x0) {
              pcVar12 = "-o output filename can only be specified once\n";
              goto LAB_00108f8e;
            }
            this->outFile = __x[1];
            goto LAB_00108817;
          }
          iVar4 = strcmp(pcVar12,"-16");
          if (iVar4 == 0) {
            if (local_94 < iVar6) {
              poVar13 = (ostream *)&std::cerr;
              pcVar12 = "Missing mode with -16 option\n";
              lVar8 = 0x1d;
              goto LAB_00108c99;
            }
            pcVar12 = __x[1];
            iVar4 = strcmp(pcVar12,"all");
            if (iVar4 == 0) {
              local_90 = (long *)CONCAT44(local_90._4_4_,1);
              iVar11._M_current =
                   (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              if (iVar11._M_current ==
                  (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_00108b78:
                std::vector<PixelMode,_std::allocator<PixelMode>_>::_M_realloc_insert<PixelMode>
                          (local_70,iVar11,(PixelMode *)&local_90);
              }
              else {
                *iVar11._M_current = PIXELMODE_ALL_HALF;
                (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>._M_impl
                .super__Vector_impl_data._M_finish = iVar11._M_current + 1;
              }
            }
            else {
              iVar4 = strcmp(pcVar12,"rgba");
              if (iVar4 != 0) {
                poVar13 = (ostream *)&std::cerr;
                pcVar12 = " bad mode for -16 option: must be \'all\' or \'rgba\'\n";
                lVar8 = 0x32;
                goto LAB_00108c99;
              }
              local_90 = (long *)CONCAT44(local_90._4_4_,3);
              iVar11._M_current =
                   (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              if (iVar11._M_current ==
                  (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00108b78;
              *iVar11._M_current = PIXELMODE_MIXED_HALF_FLOAT;
              (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar11._M_current + 1;
            }
            goto LAB_00108817;
          }
          iVar4 = strcmp(pcVar12,"--pixelmode");
          if (iVar4 == 0) {
            if (iVar6 <= local_94) {
              split_abi_cxx11_((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_68,__x[1],',');
              pPVar2 = (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              if ((this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>.
                  _M_impl.super__Vector_impl_data._M_finish != pPVar2) {
                (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>._M_impl
                .super__Vector_impl_data._M_finish = pPVar2;
              }
              bVar15 = local_68._M_impl._M_node.super__List_node_base._M_next ==
                       (_List_node_base *)&local_68;
              p_Var14 = local_68._M_impl._M_node.super__List_node_base._M_next;
              while (!bVar15) {
                local_90 = local_80;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_90,p_Var14[1]._M_next,
                           (long)&(p_Var14[1]._M_prev)->_M_next + (long)p_Var14[1]._M_next);
                iVar4 = std::__cxx11::string::compare((char *)&local_90);
                if (iVar4 == 0) {
                  local_98 = PIXELMODE_ALL_HALF;
                  iVar11._M_current =
                       (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  if (iVar11._M_current ==
                      (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<PixelMode,_std::allocator<PixelMode>_>::_M_realloc_insert<PixelMode>
                              (local_70,iVar11,&local_98);
                  }
                  else {
                    *iVar11._M_current = PIXELMODE_ALL_HALF;
LAB_001089cd:
                    (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>.
                    _M_impl.super__Vector_impl_data._M_finish = iVar11._M_current + 1;
                  }
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)&local_90);
                  if (iVar4 == 0) {
                    local_98 = PIXELMODE_ALL_FLOAT;
                    iVar11._M_current =
                         (this->pixelModes).
                         super__Vector_base<PixelMode,_std::allocator<PixelMode>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar11._M_current !=
                        (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      *iVar11._M_current = PIXELMODE_ALL_FLOAT;
                      goto LAB_001089cd;
                    }
                    std::vector<PixelMode,_std::allocator<PixelMode>_>::_M_realloc_insert<PixelMode>
                              (local_70,iVar11,&local_98);
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare((char *)&local_90);
                    if ((iVar4 == 0) ||
                       (iVar4 = std::__cxx11::string::compare((char *)&local_90), iVar4 == 0)) {
                      local_98 = PIXELMODE_MIXED_HALF_FLOAT;
                      iVar11._M_current =
                           (this->pixelModes).
                           super__Vector_base<PixelMode,_std::allocator<PixelMode>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                      if (iVar11._M_current !=
                          (this->pixelModes).
                          super__Vector_base<PixelMode,_std::allocator<PixelMode>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        *iVar11._M_current = PIXELMODE_MIXED_HALF_FLOAT;
                        goto LAB_001089cd;
                      }
                      std::vector<PixelMode,_std::allocator<PixelMode>_>::
                      _M_realloc_insert<PixelMode>(local_70,iVar11,&local_98);
                    }
                    else {
                      iVar4 = std::__cxx11::string::compare((char *)&local_90);
                      if (iVar4 != 0) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,"bad pixel type ",0xf);
                        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cerr,(char *)local_90,local_88);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar13,
                                   " for --pixelmode: must be half,float,rgba,mixed or orig\n",0x38)
                        ;
                        if (local_90 != local_80) {
                          operator_delete(local_90,local_80[0] + 1);
                        }
                        break;
                      }
                      local_98 = PIXELMODE_ORIGINAL;
                      iVar11._M_current =
                           (this->pixelModes).
                           super__Vector_base<PixelMode,_std::allocator<PixelMode>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                      if (iVar11._M_current !=
                          (this->pixelModes).
                          super__Vector_base<PixelMode,_std::allocator<PixelMode>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        *iVar11._M_current = PIXELMODE_ORIGINAL;
                        goto LAB_001089cd;
                      }
                      std::vector<PixelMode,_std::allocator<PixelMode>_>::
                      _M_realloc_insert<PixelMode>(local_70,iVar11,&local_98);
                    }
                  }
                }
                if (local_90 != local_80) {
                  operator_delete(local_90,local_80[0] + 1);
                }
                p_Var14 = p_Var14->_M_next;
                bVar15 = p_Var14 == (_List_node_base *)&local_68;
              }
              std::__cxx11::
              _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::_M_clear(&local_68);
              bVar15 = !bVar15;
              iVar4 = iVar6 + 2;
              if (bVar15) {
                iVar4 = iVar6;
              }
              goto LAB_0010872f;
            }
            pcVar12 = "Missing type list with  with --pixelmode option\n";
            goto LAB_0010902a;
          }
          iVar4 = strcmp(pcVar12,"--time");
          if (iVar4 == 0) {
            if (local_94 < iVar6) {
              poVar13 = (ostream *)&std::cerr;
              pcVar12 = "Missing value list with --time option\n";
              lVar8 = 0x26;
              goto LAB_00108c99;
            }
            this->timing = 0;
            pcVar12 = __x[1];
            iVar4 = strcmp(pcVar12,"none");
            if (iVar4 != 0) {
              split_abi_cxx11_((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_68,pcVar12,',');
              p_Var14 = local_68._M_impl._M_node.super__List_node_base._M_next;
              if (local_68._M_impl._M_node.super__List_node_base._M_next !=
                  (_List_node_base *)&local_68) {
                do {
                  local_90 = local_80;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_90,p_Var14[1]._M_next,
                             (long)&(p_Var14[1]._M_prev)->_M_next + (long)p_Var14[1]._M_next);
                  iVar4 = std::__cxx11::string::compare((char *)&local_90);
                  if (iVar4 == 0) {
                    uVar7 = 1;
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare((char *)&local_90);
                    if (iVar4 == 0) {
                      uVar7 = 4;
                    }
                    else {
                      iVar4 = std::__cxx11::string::compare((char *)&local_90);
                      uVar7 = 2;
                      if (iVar4 != 0) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,
                                   "bad value in timing list. Options are read,write,reread\n",0x38)
                        ;
                        if (local_90 != local_80) {
                          operator_delete(local_90,local_80[0] + 1);
                        }
                        std::__cxx11::
                        _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::_M_clear(&local_68);
                        return 1;
                      }
                    }
                  }
                  this->timing = this->timing | uVar7;
                  if (local_90 != local_80) {
                    operator_delete(local_90,local_80[0] + 1);
                  }
                  p_Var14 = p_Var14->_M_next;
                } while (p_Var14 != (_List_node_base *)&local_68);
              }
              std::__cxx11::
              _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::_M_clear(&local_68);
            }
            goto LAB_00108817;
          }
          iVar4 = strcmp(pcVar12,"--no-size");
          if (iVar4 == 0) {
            this->outputSizeData = false;
            goto LAB_001083f2;
          }
          iVar4 = strcmp(pcVar12,"-i");
          if (iVar4 == 0) {
            if (iVar6 <= local_94) {
              std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back(local_48,__x + 1);
              iVar6 = iVar6 + 2;
              goto LAB_0010842a;
            }
            poVar13 = (ostream *)&std::cerr;
            pcVar12 = "Missing filename with -i option\n";
            lVar8 = 0x20;
            goto LAB_00108c99;
          }
          std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back(local_48,__x);
        }
      }
    }
  }
LAB_001083f2:
  iVar6 = iVar6 + 1;
LAB_0010842a:
  if ((int)local_40 <= iVar6) goto LAB_00108c47;
  goto LAB_001081de;
}

Assistant:

int
options::parse (int argc, char* argv[])
{

    int i = 1;

    timing = TIME_READ | TIME_WRITE | TIME_REREAD;

    if (argc == 1)
    {
        usageMessage (cerr, "exrmetrics", true);
        return 1;
    }

    while (i < argc)
    {
        if (!strcmp (argv[i], "-h") || !strcmp (argv[i], "--help"))
        {
            usageMessage (cout, "exrmetrics", true);
            return 0;
        }

        else if (!strcmp (argv[i], "--version"))
        {
            const char* libraryVersion = getLibraryVersion ();

            cout << "exrmetrics (OpenEXR) " << OPENEXR_VERSION_STRING;
            if (strcmp (libraryVersion, OPENEXR_VERSION_STRING))
                cout << "(OpenEXR version " << libraryVersion << ")";
            cout << " https://openexr.com" << endl;
            cout << "Copyright (c) Contributors to the OpenEXR Project" << endl;
            cout << "License BSD-3-Clause" << endl;
            return 0;
        }
        else if (!strcmp (argv[i], "-m"))
        {
            threads = -1;
            i += 1;
        }
        else if (!strcmp (argv[i], "-t"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing thread count value with -t option\n";
                return 1;
            }

            threads = atoi (argv[i + 1]);
            if (threads < 0)
            {
                cerr << "bad thread count " << argv[i + 1]
                     << " specified to -t option\n";
                return 1;
            }

            i += 2;
        }
        else if (!strcmp (argv[i], "--bench"))
        {
            compressions.clear ();
            for (int c = 0; c < NUM_COMPRESSION_METHODS; ++c)
            {
                compressions.push_back (Compression (c));
            }
            passes         = 10;
            outputSizeData = false;
            csv            = true;
            part           = -1;
            timing         = TIME_WRITE | TIME_REREAD;
            pixelModes.resize (2);
            pixelModes[0] = PIXELMODE_ALL_HALF;
            pixelModes[1] = PIXELMODE_ALL_FLOAT;
            i += 1;
        }
        else if (!strcmp (argv[i], "--convert"))
        {
            pixelModes.resize (1);
            pixelModes[0]  = PIXELMODE_ORIGINAL;
            passes         = 1;
            outputSizeData = false;
            timing         = 0;
            part           = -1;
            i += 1;
        }
        else if (!strcmp (argv[i], "--passes"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing pass count value with --passes option\n";
                return 1;
            }
            passes = atoi (argv[i + 1]);
            if (passes < 0)
            {
                cerr << "bad value for passes " << argv[i + 1]
                     << " specified to --passes option\n";
                return 1;
            }
            i += 2;
        }
        else if (!strcmp (argv[i], "-v"))
        {
            verbose = true;
            i += 1;
        }
        else if (!strcmp (argv[i], "--csv"))
        {
            csv = true;
            i += 1;
        }
        else if (!strcmp (argv[i], "--json"))
        {
            csv = false;
            i += 1;
        }
        else if (!strcmp (argv[i], "-z") || !strcmp (argv[i], "--compression"))
        {
            compressions.clear ();
            if (i > argc - 2)
            {
                cerr << "Missing compression value with " << argv[i]
                     << " option\n";
                return 1;
            }
            std::list<string> items = split (argv[i + 1], ',');

            for (string i: items)
            {

                if (i == "orig")
                {
                    compressions.push_back (NUM_COMPRESSION_METHODS);
                }
                else if (i == "all")
                {
                    for (int c = 0; c < NUM_COMPRESSION_METHODS; ++c)
                    {
                        compressions.push_back (Compression (c));
                    }
                }
                else
                {
                    Compression compression;
                    getCompressionIdFromName (i, compression);
                    if (compression == Compression::NUM_COMPRESSION_METHODS)
                    {
                        cerr << "unknown compression type " << i << endl;
                        return 1;
                    }
                    compressions.push_back (compression);
                }
            }
            i += 2;
        }
        else if (!strcmp (argv[i], "-p"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing part number with -p option\n";
                return 1;
            }
            if (!strcmp (argv[i + 1], "all")) { part = -1; }
            else
            {
                part = atoi (argv[i + 1]);
                if (part < -1)
                {
                    cerr << "bad part " << part << " specified to -p option\n";
                    return 1;
                }
            }

            i += 2;
        }
        else if (!strcmp (argv[i], "-l"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing compression level number with -l option\n";
                return 1;
            }
            level = atof (argv[i + 1]);
            if (level < 0)
            {
                cerr << "bad level " << level << " specified to -l option\n";
                return 1;
            }

            i += 2;
        }
        else if (!strcmp (argv[i], "-o"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing filename specified with -o\n";
                return 1;
            }
            if (outFile)
            {
                cerr << "-o output filename can only be specified once\n";
                return 1;
            }
            outFile = argv[i + 1];
            i += 2;
        }
        // deprecated flag for backwards compatibility
        else if (!strcmp (argv[i], "-16"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing mode with -16 option\n";
                return 1;
            }
            if (!strcmp (argv[i + 1], "all"))
            {
                pixelModes.push_back (PIXELMODE_ALL_HALF);
            }
            else if (!strcmp (argv[i + 1], "rgba"))
            {
                pixelModes.push_back (PIXELMODE_MIXED_HALF_FLOAT);
            }
            else
            {
                cerr << " bad mode for -16 option: must be 'all' or 'rgba'\n";
                return 1;
            }
            i += 2;
        }
        else if (!strcmp (argv[i], "--pixelmode"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing type list with  with --pixelmode option\n";
                return 1;
            }
            std::list<string> items = split (argv[i + 1], ',');
            pixelModes.clear ();
            for (string i: items)
            {
                if (i == "half") { pixelModes.push_back (PIXELMODE_ALL_HALF); }
                else if (i == "float")
                {
                    pixelModes.push_back (PIXELMODE_ALL_FLOAT);
                }
                else if (i == "rgba" || i == "mixed")
                {
                    pixelModes.push_back (PIXELMODE_MIXED_HALF_FLOAT);
                }
                else if (i == "orig")
                {
                    pixelModes.push_back (PIXELMODE_ORIGINAL);
                }
                else
                {
                    cerr
                        << "bad pixel type " << i
                        << " for --pixelmode: must be half,float,rgba,mixed or orig\n";
                    return 1;
                }
            }
            i += 2;
        }
        else if (!strcmp (argv[i], "--time"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing value list with --time option\n";
                return 1;
            }

            timing = TIME_NONE;
            if (strcmp (argv[i + 1], "none"))
            {
                std::list<string> items = split (argv[i + 1], ',');
                for (string i: items)
                {
                    if (i == "read") { timing |= TIME_READ; }
                    else if (i == "reread") { timing |= TIME_REREAD; }
                    else if (i == "write") { timing |= TIME_WRITE; }
                    else
                    {
                        cerr
                            << "bad value in timing list. Options are read,write,reread\n";
                        return 1;
                    }
                }
            }
            i += 2;
        }
        else if (!strcmp (argv[i], "--no-size"))
        {
            outputSizeData = false;
            i += 1;
        }
        else if (!strcmp (argv[i], "-i"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing filename with -i option\n";
                return 1;
            }
            inFiles.push_back (argv[i + 1]);
            i += 2;
        }
        else
        {
            inFiles.push_back (argv[i]);
            i += 1;
        }
    }
    if (inFiles.size () == 0)
    {
        cerr << "Missing input file\n";
        usageMessage (cerr, "exrmetrics", false);
        return 1;
    }

    if (!outputSizeData && !timing && !outFile)
    {
        cerr
            << "Nothing to do: no output file specified, and all performance/size data disabled";
        cerr << "Use -o to specify output image filename\n";
        return 1;
    }

    // default options if none specified
    if (pixelModes.size () == 0) { pixelModes.push_back (PIXELMODE_ORIGINAL); }

    if (compressions.size () == 0)
    {
        compressions.push_back (NUM_COMPRESSION_METHODS);
    }

    return 0;
}